

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O2

void __thiscall Matrix<int,_6UL,_6UL>::dump(Matrix<int,_6UL,_6UL> *this,ostream *os)

{
  int *piVar1;
  ostream *poVar2;
  int j;
  size_t col;
  int i;
  size_t row;
  
  for (row = 0; row != 6; row = row + 1) {
    for (col = 0; col != 6; col = col + 1) {
      piVar1 = at(this,row,col);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,*piVar1);
      std::operator<<(poVar2,"\t");
    }
    std::endl<char,std::char_traits<char>>(os);
  }
  return;
}

Assistant:

void dump(std::ostream &os) {
    for (int i = 0; i < Row; ++i) {
      for (int j = 0; j < Col; ++j) {
        os << at(i, j) << "\t";
      }
      os << std::endl;
    }
  }